

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateFastCmTypeOf
          (Lowerer *this,Instr *compare,RegOpnd *object,IntConstOpnd *typeIdOpnd,Instr *typeOf,
          bool *pfNoLower,bool isNeqOp)

{
  TypeId typeIdToCheck;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 offset;
  BailOutKind BVar4;
  LabelInstr *done;
  LabelInstr *target;
  LabelInstr *target_00;
  RegOpnd *this_00;
  RegOpnd *typeOpnd;
  undefined4 *puVar5;
  Opnd *pOVar6;
  LabelInstr *pLVar7;
  IndirOpnd *pIVar8;
  Lowerer *dst;
  IntConstOpnd *pIVar9;
  BailOutInfo *bailoutInfo;
  OpCode branchOpCode;
  LabelInstr *labelTarget;
  Lowerer *pLVar10;
  Lowerer *local_78;
  
  uVar3 = compare->m_opcode - 0x3b;
  if ((7 < uVar3) || ((0xe1U >> (uVar3 & 0x1f) & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x62fc,
                       "(compare->m_opcode == Js::OpCode::CmSrEq_A || compare->m_opcode == Js::OpCode::CmEq_A || compare->m_opcode == Js::OpCode::CmSrNeq_A || compare->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "compare->m_opcode == Js::OpCode::CmSrEq_A || compare->m_opcode == Js::OpCode::CmEq_A || compare->m_opcode == Js::OpCode::CmSrNeq_A || compare->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar2) goto LAB_00581ec5;
    *puVar5 = 0;
  }
  typeIdToCheck = (TypeId)(typeIdOpnd->super_EncodableOpnd<long>).m_value;
  this_00 = (RegOpnd *)0x0;
  done = IR::LabelInstr::New(Label,this->m_func,false);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  target_00 = IR::LabelInstr::New(Label,this->m_func,true);
  bVar2 = IR::Opnd::IsRegOpnd(compare->m_dst);
  if (bVar2) {
    this_00 = IR::Opnd::AsRegOpnd(compare->m_dst);
  }
  typeOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  if (this_00 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6305,"(dst)","dst");
    if (!bVar2) {
LAB_00581ec5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = IR::Opnd::IsEqual(&this_00->super_Opnd,&object->super_Opnd);
  local_78 = (Lowerer *)object;
  if (bVar2) {
    local_78 = (Lowerer *)IR::RegOpnd::New((object->super_Opnd).m_type,this->m_func);
    InsertMove((Opnd *)local_78,&object->super_Opnd,compare,true);
  }
  pOVar6 = LoadLibraryValueOpnd(this,compare,ValueTrue);
  InsertMove(&this_00->super_Opnd,pOVar6,compare,true);
  pLVar7 = done;
  if (typeIdToCheck == TypeIds_Number) {
    pLVar7 = target;
  }
  labelTarget = target;
  if (pLVar7 == target) {
    labelTarget = done;
  }
  if (!isNeqOp) {
    labelTarget = pLVar7;
  }
  LowererMD::GenerateObjectTest(&this->m_lowererMD,(Opnd *)local_78,compare,labelTarget,false);
  pIVar8 = IR::IndirOpnd::New((RegOpnd *)local_78,8,TyInt64,this->m_func,false);
  InsertMove(&typeOpnd->super_Opnd,&pIVar8->super_Opnd,compare,true);
  GenerateFalsyObjectTest(this,compare,typeOpnd,typeIdToCheck,target,done,isNeqOp);
  dst = (Lowerer *)IR::RegOpnd::New(TyInt32,this->m_func);
  offset = Js::Type::GetOffsetOfTypeId();
  pIVar8 = IR::IndirOpnd::New(typeOpnd,offset,TyInt32,this->m_func,false);
  pLVar10 = dst;
  InsertMove((Opnd *)dst,&pIVar8->super_Opnd,compare,true);
  pLVar7 = done;
  if (typeIdToCheck == TypeIds_Object) {
    if (!isNeqOp) {
      pLVar7 = target;
    }
    InsertCompareBranch(pLVar10,(Opnd *)dst,&typeIdOpnd->super_Opnd,BrGe_A,pLVar7,compare,false);
    pLVar10 = this;
    typeIdOpnd = (IntConstOpnd *)LoadLibraryValueOpnd(this,compare,ValueNull);
    branchOpCode = BrEq_A;
  }
  else {
    local_78 = dst;
    if (typeIdToCheck == TypeIds_Function) {
      if (!isNeqOp) {
        pLVar7 = target;
      }
      branchOpCode = BrEq_A;
    }
    else if (typeIdToCheck == TypeIds_Number) {
      pLVar10 = (Lowerer *)0x6;
      pIVar9 = IR::IntConstOpnd::New(6,TyInt32,compare->m_func,false);
      pLVar7 = target;
      if (!isNeqOp) {
        pLVar7 = done;
      }
      InsertCompareBranch(pLVar10,(Opnd *)dst,&pIVar9->super_Opnd,BrGt_A,pLVar7,compare,false);
      pLVar10 = (Lowerer *)0x3;
      typeIdOpnd = IR::IntConstOpnd::New(3,TyInt32,compare->m_func,false);
      branchOpCode = (ushort)isNeqOp * 2 + BrGe_A;
      pLVar7 = target;
    }
    else {
      branchOpCode = isNeqOp | BrEq_A;
      pLVar7 = target;
    }
  }
  InsertCompareBranch(pLVar10,(Opnd *)local_78,&typeIdOpnd->super_Opnd,branchOpCode,pLVar7,compare,
                      false);
  IR::Instr::InsertAfter(compare,&target->super_Instr);
  if (typeIdToCheck - TypeIds_Function < 2) {
    pLVar10 = (Lowerer *)0x1a;
    pIVar9 = IR::IntConstOpnd::New(0x1a,TyInt32,this->m_func,false);
    InsertCompareBranch(pLVar10,(Opnd *)dst,&pIVar9->super_Opnd,BrEq_A,target_00,compare,false);
    pLVar10 = (Lowerer *)0x17;
    pIVar9 = IR::IntConstOpnd::New(0x17,TyInt32,this->m_func,false);
    pLVar7 = target;
    if (!isNeqOp) {
      pLVar7 = done;
    }
    InsertCompareBranch(pLVar10,(Opnd *)dst,&pIVar9->super_Opnd,BrNeq_A,pLVar7,compare,false);
    IR::Instr::InsertBefore(compare,&target_00->super_Instr);
    IR::Instr::Unlink(typeOf);
    IR::Instr::InsertBefore(compare,typeOf);
    if ((((compare->field_0x38 & 0x10) != 0) &&
        (BVar4 = IR::Instr::GetBailOutKind(compare),
        (BVar4 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls)) &&
       (((typeOf->field_0x38 & 0x10) == 0 ||
        (BVar4 = IR::Instr::GetBailOutKind(typeOf),
        (BVar4 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls)))) {
      bailoutInfo = IR::Instr::GetBailOutInfo(compare);
      BVar4 = IR::Instr::GetBailOutKind(compare);
      typeOf = AddBailoutToHelperCallInstr(this,typeOf,bailoutInfo,BVar4,compare);
    }
    LowerUnaryHelperMem(this,typeOf,HelperOp_Typeof,(Opnd *)0x0);
    InsertBranch(Br,target,&target->super_Instr);
  }
  else {
    IR::Instr::Remove(typeOf);
    pOVar6 = IR::Instr::UnlinkDst(compare);
    this_00 = IR::Opnd::AsRegOpnd(pOVar6);
    IR::Instr::Remove(compare);
    *pfNoLower = true;
  }
  IR::Instr::InsertBefore(&target->super_Instr,&done->super_Instr);
  pOVar6 = LoadLibraryValueOpnd(this,&target->super_Instr,ValueFalse);
  InsertMove(&this_00->super_Opnd,pOVar6,&target->super_Instr,true);
  return;
}

Assistant:

void
Lowerer::GenerateFastCmTypeOf(IR::Instr *compare, IR::RegOpnd *object, IR::IntConstOpnd *typeIdOpnd, IR::Instr *typeOf, bool *pfNoLower, bool isNeqOp)
{
    Assert(compare->m_opcode == Js::OpCode::CmSrEq_A  ||
           compare->m_opcode == Js::OpCode::CmEq_A    ||
           compare->m_opcode == Js::OpCode::CmSrNeq_A ||
           compare->m_opcode == Js::OpCode::CmNeq_A);

    Js::TypeId      typeId   = static_cast<Js::TypeId>(typeIdOpnd->GetValue());
    IR::LabelInstr *movFalse = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *done = IR::LabelInstr::New(Js::OpCode::Label, m_func, false);
    IR::LabelInstr *helper= IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::RegOpnd    *dst      = compare->GetDst()->IsRegOpnd() ? compare->GetDst()->AsRegOpnd() : nullptr;
    IR::RegOpnd    *typeRegOpnd  = IR::RegOpnd::New(TyMachReg, m_func);

    Assert(dst);

    if (dst->IsEqual(object))
    {
        //dst same as the src of typeof. As we need to move true to dst first we need to save the src to a new opnd
        IR::RegOpnd *newObject = IR::RegOpnd::New(object->GetType(), m_func);
        InsertMove(newObject, object, compare); //Save src
        object = newObject;
    }

    // mov dst, 'true'
    InsertMove(dst,
               LoadLibraryValueOpnd(compare, LibraryValue::ValueTrue),
               compare);

    // TEST object, 1
    // JNE (typeId == Js::TypeIds_Number) ? $done : $movFalse
    IR::LabelInstr *target = (typeId == Js::TypeIds_Number) ? done : movFalse;
    if (isNeqOp)
    {
        target = (target == done) ? movFalse : done;
    }

    m_lowererMD.GenerateObjectTest(object, compare, target);

    // MOV typeRegOpnd, [object + offset(Type)]
    InsertMove(typeRegOpnd,
               IR::IndirOpnd::New(object, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func),
               compare);

    GenerateFalsyObjectTest(compare, typeRegOpnd, typeId, done, movFalse, isNeqOp);

    // MOV objTypeId, [typeRegOpnd + offset(TypeId)]
    IR::RegOpnd* objTypeIdOpnd = IR::RegOpnd::New(TyInt32, m_func);
    InsertMove(objTypeIdOpnd,
               IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, m_func),
               compare);

    // CMP objTypeId, typeId
    // JEQ/JGE $done
    if (typeId == Js::TypeIds_Object)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrGe_A, isNeqOp ? movFalse : done, compare);
    }
    else if (typeId == Js::TypeIds_Function)
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, Js::OpCode::BrEq_A, isNeqOp ? movFalse : done, compare);
    }
    else if (typeId == Js::TypeIds_Number)
    {
        //Check for the typeIds between  TypeIds_FirstNumberType <= typeIds <= TypeIds_LastNumberType
        InsertCompareBranch(objTypeIdOpnd,
                                IR::IntConstOpnd::New(Js::TypeIds_LastNumberType, TyInt32, compare->m_func),
                                Js::OpCode::BrGt_A,
                                isNeqOp ? done : movFalse,
                                compare);

        InsertCompareBranch(objTypeIdOpnd,
                                IR::IntConstOpnd::New(Js::TypeIds_FirstNumberType, TyInt32, compare->m_func),
                                isNeqOp? Js::OpCode::BrLt_A : Js::OpCode::BrGe_A,
                                done,
                                compare);
    }
    else
    {
        InsertCompareBranch(objTypeIdOpnd, typeIdOpnd, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, done, compare);
    }

    // This could be 'null' which, for historical reasons, has a TypeId < TypeIds_Object but
    // is still a Javascript "object."
    if (typeId == Js::TypeIds_Object)
    {
        // CMP object, 0xXXXXXXXX
        // JEQ isNeqOp ? $movFalse : $done
        InsertCompareBranch(object,
                            LoadLibraryValueOpnd(compare, LibraryValue::ValueNull),
                            Js::OpCode::BrEq_A,
                            isNeqOp ? movFalse : done,
                            compare);
    }

    compare->InsertAfter(done); // Get this label first

    // "object" or "function" may come from HostDispatch. Needs helper if that's the case.
    if (typeId == Js::TypeIds_Object || typeId == Js::TypeIds_Function)
    {
        // CMP objTypeId, TypeIds_Proxy
        // JNE isNeqOp ? $done : $movFalse
        InsertCompareBranch(objTypeIdOpnd,
            IR::IntConstOpnd::New(Js::TypeIds_Proxy, TyInt32, m_func),
            Js::OpCode::BrEq_A,
            helper,
            compare);

        // CMP objTypeId, TypeIds_HostDispatch
        // JNE isNeqOp ? $done : $movFalse
        InsertCompareBranch(objTypeIdOpnd,
                            IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, m_func),
                            Js::OpCode::BrNeq_A,
                            isNeqOp ? done : movFalse,
                            compare);

        // Now emit Typeof like we would've for the helper call.
        {
            compare->InsertBefore(helper);
            typeOf->Unlink();
            compare->InsertBefore(typeOf);
            if (compare->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(compare->GetBailOutKind()) &&
                (!typeOf->HasBailOutInfo() || !BailOutInfo::IsBailOutOnImplicitCalls(typeOf->GetBailOutKind())))
            {
                typeOf = AddBailoutToHelperCallInstr(typeOf, compare->GetBailOutInfo(), compare->GetBailOutKind(), compare);
            }
            LowerUnaryHelperMem(typeOf, IR::HelperOp_Typeof);
        }

        // JMP/B $done
        InsertBranch(Js::OpCode::Br, done, done);
    }
    else // Other primitive types don't need helper
    {
        typeOf->Remove();
        dst = compare->UnlinkDst()->AsRegOpnd();
        compare->Remove();
        *pfNoLower = true;
    }

    // $movFalse: (insert before $done)
    done->InsertBefore(movFalse);

    // MOV dst, 'false'
    InsertMove(dst, LoadLibraryValueOpnd(done, LibraryValue::ValueFalse), done);

    // $done:
}